

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureCubeMapFaceCase::test
          (AttachmentTextureCubeMapFaceCase *this)

{
  CallLogWrapper *testCtx;
  GLenum textarget;
  GLuint pname;
  GLenum reference;
  long lVar1;
  GLuint textureID;
  GLuint framebufferID;
  
  framebufferID = 0;
  testCtx = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(testCtx,1,&framebufferID);
  glu::CallLogWrapper::glBindFramebuffer(testCtx,0x8d40,framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(testCtx,1,&textureID);
  glu::CallLogWrapper::glBindTexture(testCtx,0x8513,textureID);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glTexStorage2D(testCtx,0x8513,1,0x8051,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 4) {
    textarget = *(GLenum *)((long)&DAT_01865210 + lVar1);
    reference = 0;
    pname = textureID;
    glu::CallLogWrapper::glFramebufferTexture2D(testCtx,0x8d40,0x8ce0,textarget,textureID,0);
    checkColorAttachmentParam
              ((anon_unknown_1 *)
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (TestContext *)testCtx,(CallLogWrapper *)0x8cd3,textarget,pname,reference);
  }
  glu::CallLogWrapper::glFramebufferTexture2D(testCtx,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(testCtx,1,&textureID);
  glu::CallLogWrapper::glDeleteFramebuffers(testCtx,1,&framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_CUBE_MAP, textureID);
			expectError(GL_NO_ERROR);

			glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, GL_RGB8, 128, 128);
			expectError(GL_NO_ERROR);

			const GLenum faces[] =
			{
				GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			};

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(faces); ++ndx)
			{
				glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, faces[ndx], textureID, 0);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, faces[ndx]);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}